

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O2

int __thiscall bdNodeManager::checkBadPeerStatus(bdNodeManager *this)

{
  uint32_t flags_00;
  bool bVar1;
  uint32_t flags;
  string nullstr;
  string local_78;
  bdId id;
  
  bdId::bdId(&id);
  nullstr._M_dataplus._M_p = (pointer)&nullstr.field_2;
  nullstr._M_string_length = 0;
  nullstr.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = bdPeerQueue::popPeer(&(this->super_bdNode).mBadPeerQueue,&id,&flags);
    flags_00 = flags;
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&local_78,(string *)&nullstr);
    doInfoCallback(this,&id,1,flags_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&nullstr);
  return 1;
}

Assistant:

int bdNodeManager::checkBadPeerStatus() {
	bdId id;
	uint32_t flags;
	std::string nullstr;

	while(mBadPeerQueue.popPeer(&id, flags))
		doInfoCallback(&id, BITDHT_INFO_CB_TYPE_BADPEER, flags, nullstr);
	return 1;
}